

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall Measurement_unaryOps_Test::TestBody(Measurement_unaryOps_Test *this)

{
  unit *this_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_d0;
  Message local_c8;
  unit local_c0;
  unit local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  Message local_98;
  double local_90;
  double local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  measurement y;
  measurement z;
  measurement x;
  Measurement_unaryOps_Test *this_local;
  
  this_00 = &z.units_;
  units::measurement::measurement((measurement *)this_00,2.0,(unit *)&units::cm);
  join_0x00000000_0x00001200_ = units::measurement::operator-((measurement *)this_00);
  join_0x00000000_0x00001200_ = units::measurement::operator+((measurement *)this_00);
  testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
            ((EqHelper *)local_50,"y","x",(measurement *)&gtest_ar.message_,(measurement *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_88 = units::measurement::value((measurement *)&y.units_);
  local_90 = units::measurement::value((measurement *)&z.units_);
  local_90 = -local_90;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_80,"z.value()","-x.value()",&local_88,&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_b8 = units::measurement::units((measurement *)&y.units_);
  local_c0 = units::measurement::units((measurement *)&z.units_);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_b0,"z.units()","x.units()",&local_b8,&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  return;
}

Assistant:

TEST(Measurement, unaryOps)
{
    measurement x(2.0, cm);

    auto z = -x;
    auto y = +x;
    EXPECT_EQ(y, x);
    EXPECT_EQ(z.value(), -x.value());
    EXPECT_EQ(z.units(), x.units());
}